

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_heap.c
# Opt level: O0

void adt_heap_sortDown(adt_ary_t *heap,int32_t parentIndex,adt_heap_family heapFamily)

{
  void *pvVar1;
  void *pvVar2;
  int32_t iVar3;
  int s32Index;
  int s32Index_00;
  void **ppvVar4;
  bool bVar5;
  bool bVar6;
  void *tmp_1;
  void *tmp;
  adt_heap_elem_t *pRightElem;
  adt_heap_elem_t *pLeftElem;
  uint32_t leftChildValue;
  int32_t rightChildIndex;
  int32_t leftChildIndex;
  adt_heap_elem_t *pParentElem;
  void **ppParent;
  void **ppRight;
  void **ppLeft;
  _Bool swapRight;
  _Bool swapLeft;
  int32_t curLen;
  adt_heap_family heapFamily_local;
  int32_t parentIndex_local;
  adt_ary_t *heap_local;
  
  if (((heap != (adt_ary_t *)0x0) && (-1 < parentIndex)) &&
     (iVar3 = adt_ary_length(heap), parentIndex < iVar3)) {
    bVar5 = false;
    bVar6 = false;
    ppRight = (void **)0x0;
    ppParent = (void **)0x0;
    pLeftElem._4_4_ = 0;
    ppvVar4 = adt_ary_get(heap,parentIndex);
    if (ppvVar4 == (void **)0x0) {
      __assert_fail("ppParent != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_heap.c"
                    ,0x7c,"void adt_heap_sortDown(adt_ary_t *, int32_t, adt_heap_family)");
    }
    pvVar1 = *ppvVar4;
    s32Index = parentIndex * 2 + 1;
    s32Index_00 = parentIndex * 2 + 2;
    if (s32Index < iVar3) {
      ppRight = adt_ary_get(heap,s32Index);
      if (ppRight == (void **)0x0) {
        __assert_fail("ppLeft != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_heap.c"
                      ,0x84,"void adt_heap_sortDown(adt_ary_t *, int32_t, adt_heap_family)");
      }
      pLeftElem._4_4_ = *(uint *)((long)*ppRight + 8);
      if (heapFamily == ADT_MIN_HEAP) {
        bVar5 = pLeftElem._4_4_ < *(uint *)((long)pvVar1 + 8);
      }
      else {
        bVar5 = *(uint *)((long)pvVar1 + 8) < pLeftElem._4_4_;
      }
    }
    if (s32Index_00 < iVar3) {
      ppParent = adt_ary_get(heap,s32Index_00);
      if (ppParent == (void **)0x0) {
        __assert_fail("ppRight != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_heap.c"
                      ,0x96,"void adt_heap_sortDown(adt_ary_t *, int32_t, adt_heap_family)");
      }
      pvVar2 = *ppParent;
      if (heapFamily == ADT_MIN_HEAP) {
        bVar6 = *(uint *)((long)pvVar2 + 8) < *(uint *)((long)pvVar1 + 8);
      }
      else {
        bVar6 = *(uint *)((long)pvVar1 + 8) < *(uint *)((long)pvVar2 + 8);
      }
      if ((bVar5) && (bVar6)) {
        if (heapFamily == ADT_MIN_HEAP) {
          if (*(uint *)((long)pvVar2 + 8) < pLeftElem._4_4_) {
            bVar5 = false;
          }
        }
        else if (pLeftElem._4_4_ < *(uint *)((long)pvVar2 + 8)) {
          bVar5 = false;
        }
      }
    }
    if (bVar5) {
      pvVar1 = *ppRight;
      *ppRight = *ppvVar4;
      *ppvVar4 = pvVar1;
      if (s32Index * 2 + 1 < iVar3) {
        adt_heap_sortDown(heap,s32Index,heapFamily);
      }
    }
    else if (bVar6) {
      pvVar1 = *ppParent;
      *ppParent = *ppvVar4;
      *ppvVar4 = pvVar1;
      if (s32Index_00 * 2 + 1 < iVar3) {
        adt_heap_sortDown(heap,s32Index_00,heapFamily);
      }
    }
  }
  return;
}

Assistant:

void adt_heap_sortDown(adt_ary_t *heap, int32_t parentIndex, adt_heap_family heapFamily){
   if ( (heap != 0) && (parentIndex>=0) ){
      int32_t curLen = adt_ary_length(heap);
      if (parentIndex < curLen ){
         bool swapLeft = false, swapRight = false;
         void **ppLeft = 0, **ppRight = 0, **ppParent;
         adt_heap_elem_t *pParentElem;
         int32_t leftChildIndex, rightChildIndex;
         uint32_t leftChildValue = 0;

         ppParent = adt_ary_get(heap, parentIndex);
         assert(ppParent != 0);
         pParentElem = *ppParent;
         //children indices at 2i+1, 2i+2
         leftChildIndex = (parentIndex<<1) + 1;
         rightChildIndex = leftChildIndex + 1;
         if(leftChildIndex < curLen){
            adt_heap_elem_t *pLeftElem;
            ppLeft = adt_ary_get(heap, leftChildIndex);
            assert(ppLeft != 0);
            pLeftElem = *ppLeft;
            leftChildValue = pLeftElem->u32Value;
            if (heapFamily == ADT_MIN_HEAP){
               if (leftChildValue < pParentElem->u32Value){
                  swapLeft = true;
               }
            }
            else {
               //implicit ADT_MAX_HEAP
               if (leftChildValue > pParentElem->u32Value){
                  swapLeft = true;
               }
            }
         }
         if( rightChildIndex < curLen ){
            adt_heap_elem_t *pRightElem;
            ppRight = adt_ary_get(heap, rightChildIndex);
            assert(ppRight != 0);
            pRightElem = *ppRight;
            if (heapFamily == ADT_MIN_HEAP){
               if (pRightElem->u32Value < pParentElem->u32Value){
                  swapRight = true;
               }
            }
            else {
               //implicit ADT_MAX_HEAP
               if (pRightElem->u32Value > pParentElem->u32Value){
                  swapRight = true;
               }
            }
            if ( (swapLeft == true) && (swapRight == true) ){
               //compare which of the two children has the lowest priority
               if (heapFamily == ADT_MIN_HEAP){
                  if (pRightElem->u32Value < leftChildValue){
                     swapLeft = false;
                  }
               }
               else {
                  //implicit ADT_MAX_HEAP
                  if (pRightElem->u32Value > leftChildValue){
                     swapLeft = false;
                  }
               }
            }
         }
         if (swapLeft == true){
            //swap parent and left child
            void *tmp;
            tmp = *ppLeft;
            *ppLeft = *ppParent;
            *ppParent = tmp;

            //call recursively on left child (trickle down)
            if ( ( (leftChildIndex<<1) + 1) < curLen) {
               adt_heap_sortDown(heap, leftChildIndex, heapFamily);
            }
         }
         else if (swapRight == true){
            //swap parent and left child
            void *tmp;
            tmp = *ppRight;
            *ppRight = *ppParent;
            *ppParent = tmp;

            //call recursively on right child (trickle down)
            if ( ( (rightChildIndex<<1) + 1) < curLen) {
               adt_heap_sortDown(heap, rightChildIndex, heapFamily);
            }
         }
         else{
            //do nothing
         }
      }
   }
}